

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O3

void SzArEx_Free(CSzArEx *p,ISzAlloc *alloc)

{
  ISzAlloc *alloc_00;
  
  (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,p->UnpackPositions);
  (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,p->IsDirs);
  (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,p->FolderToFile);
  (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,p->FileToFolder);
  (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,p->FileNameOffsets);
  (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,p->FileNames);
  (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,(p->CRCs).Defs);
  (p->CRCs).Defs = (Byte *)0x0;
  (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,(p->CRCs).Vals);
  (p->CRCs).Vals = (UInt32 *)0x0;
  (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,(p->Attribs).Defs);
  (p->Attribs).Defs = (Byte *)0x0;
  (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,(p->Attribs).Vals);
  (p->Attribs).Vals = (UInt32 *)0x0;
  (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,(p->MTime).Defs);
  (p->MTime).Defs = (Byte *)0x0;
  (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,(p->MTime).Vals);
  (p->MTime).Vals = (CNtfsFileTime *)0x0;
  (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,(p->CTime).Defs);
  (p->CTime).Defs = (Byte *)0x0;
  alloc_00 = (ISzAlloc *)(p->CTime).Vals;
  (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,alloc_00);
  (p->CTime).Vals = (CNtfsFileTime *)0x0;
  SzAr_Free(&p->db,alloc_00);
  (p->db).CoderUnpackSizes = (UInt64 *)0x0;
  (p->db).CodersData = (Byte *)0x0;
  (p->db).FoToCoderUnpackSizes = (UInt32 *)0x0;
  (p->db).FoToMainUnpackSizeIndex = (Byte *)0x0;
  (p->db).FoCodersOffsets = (size_t *)0x0;
  (p->db).FoStartPackStreamIndex = (UInt32 *)0x0;
  (p->db).FolderCRCs.Defs = (Byte *)0x0;
  (p->db).FolderCRCs.Vals = (UInt32 *)0x0;
  (p->db).NumPackStreams = 0;
  (p->db).NumFolders = 0;
  (p->db).PackPositions = (UInt64 *)0x0;
  p->NumFiles = 0;
  p->dataPos = 0;
  p->UnpackPositions = (UInt64 *)0x0;
  p->IsDirs = (Byte *)0x0;
  (p->CRCs).Defs = (Byte *)0x0;
  (p->CRCs).Vals = (UInt32 *)0x0;
  (p->Attribs).Defs = (Byte *)0x0;
  (p->Attribs).Vals = (UInt32 *)0x0;
  (p->MTime).Defs = (Byte *)0x0;
  (p->MTime).Vals = (CNtfsFileTime *)0x0;
  (p->CTime).Defs = (Byte *)0x0;
  (p->CTime).Vals = (CNtfsFileTime *)0x0;
  p->FolderToFile = (UInt32 *)0x0;
  p->FileToFolder = (UInt32 *)0x0;
  p->FileNameOffsets = (size_t *)0x0;
  p->FileNames = (Byte *)0x0;
  return;
}

Assistant:

static void SzArEx_Free(CSzArEx *p, ISzAlloc *alloc)
{
  IAlloc_Free(alloc, p->UnpackPositions);
  IAlloc_Free(alloc, p->IsDirs);

  IAlloc_Free(alloc, p->FolderToFile);
  IAlloc_Free(alloc, p->FileToFolder);

  IAlloc_Free(alloc, p->FileNameOffsets);
  IAlloc_Free(alloc, p->FileNames);

  SzBitUi32s_Free(&p->CRCs, alloc);
  SzBitUi32s_Free(&p->Attribs, alloc);
  /* SzBitUi32s_Free(&p->Parents, alloc); */
  SzBitUi64s_Free(&p->MTime, alloc);
  SzBitUi64s_Free(&p->CTime, alloc);
  
  SzAr_Free(&p->db, alloc);
  SzArEx_Init(p);
}